

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c++
# Opt level: O1

void __thiscall kj::ThreadId::assertCurrentThread(ThreadId *this)

{
  long *in_FS_OFFSET;
  Fault f;
  DebugComparison<void_*const_&,_bool_*> _kjCondition;
  Fault local_38;
  DebugComparison<void_*const_&,_bool_*> local_30;
  
  local_30.right = (bool *)(*in_FS_OFFSET + -0x18);
  local_30.result = (bool *)this->id == local_30.right;
  local_30.op.content.ptr = " == ";
  local_30.op.content.size_ = 5;
  if (local_30.result) {
    return;
  }
  local_30.left = &this->id;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<void*const&,bool*>&>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common.c++"
             ,0x36,FAILED,"id == &currentThreadId","_kjCondition,",&local_30);
  _::Debug::Fault::fatal(&local_38);
}

Assistant:

void ThreadId::assertCurrentThread() const { KJ_ASSERT(id == &currentThreadId); }